

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest::~CodeGeneratorTest
          (CodeGeneratorTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CodeGeneratorTest_01643b40;
  DescriptorPool::~DescriptorPool(&this->pool_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

const FileDescriptor* BuildFile(absl::string_view schema) {
    io::ArrayInputStream input_stream(schema.data(),
                                      static_cast<int>(schema.size()));
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto)) << schema;
    proto.set_name("test.proto");
    return pool_.BuildFile(proto);
  }